

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

SmallVectorImpl<llvm::DWARFFormValue> * __thiscall
llvm::SmallVectorImpl<llvm::DWARFFormValue>::operator=
          (SmallVectorImpl<llvm::DWARFFormValue> *this,SmallVectorImpl<llvm::DWARFFormValue> *RHS)

{
  iterator MinSize;
  const_iterator pDVar1;
  const_iterator pDVar2;
  iterator pDVar3;
  iterator pDVar4;
  iterator pDVar5;
  DWARFFormValue *local_38;
  iterator NewEnd;
  size_t CurSize;
  size_t RHSSize;
  SmallVectorImpl<llvm::DWARFFormValue> *RHS_local;
  SmallVectorImpl<llvm::DWARFFormValue> *this_local;
  
  if (this != RHS) {
    MinSize = (iterator)SmallVectorBase::size((SmallVectorBase *)RHS);
    NewEnd = (iterator)SmallVectorBase::size((SmallVectorBase *)this);
    if (NewEnd < MinSize) {
      pDVar4 = (iterator)SmallVectorBase::capacity((SmallVectorBase *)this);
      if (pDVar4 < MinSize) {
        pDVar3 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::begin
                           ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)this);
        pDVar5 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::end
                           ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)this);
        SmallVectorTemplateBase<llvm::DWARFFormValue,_true>::destroy_range(pDVar3,pDVar5);
        SmallVectorBase::set_size((SmallVectorBase *)this,0);
        NewEnd = (iterator)0x0;
        SmallVectorTemplateBase<llvm::DWARFFormValue,_true>::grow
                  (&this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>,(size_t)MinSize)
        ;
      }
      else if (NewEnd != (iterator)0x0) {
        pDVar1 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::begin
                           ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)RHS);
        pDVar2 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::begin
                           ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)RHS);
        pDVar3 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::begin
                           ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)this);
        std::copy<llvm::DWARFFormValue_const*,llvm::DWARFFormValue*>
                  (pDVar1,pDVar2 + (long)NewEnd,pDVar3);
      }
      pDVar1 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::begin
                         ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)RHS);
      pDVar2 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::end
                         ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)RHS);
      pDVar3 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::begin
                         ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)this);
      SmallVectorTemplateBase<llvm::DWARFFormValue,true>::
      uninitialized_copy<llvm::DWARFFormValue_const,llvm::DWARFFormValue>
                (pDVar1 + (long)NewEnd,pDVar2,pDVar3 + (long)NewEnd,(type *)0x0);
      SmallVectorBase::set_size((SmallVectorBase *)this,(size_t)MinSize);
    }
    else {
      if (MinSize == (iterator)0x0) {
        local_38 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::begin
                             ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)this);
      }
      else {
        pDVar1 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::begin
                           ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)RHS);
        pDVar2 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::begin
                           ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)RHS);
        pDVar3 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::begin
                           ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)this);
        local_38 = std::copy<llvm::DWARFFormValue_const*,llvm::DWARFFormValue*>
                             (pDVar1,pDVar2 + (long)MinSize,pDVar3);
      }
      pDVar3 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::end
                         ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)this);
      SmallVectorTemplateBase<llvm::DWARFFormValue,_true>::destroy_range(local_38,pDVar3);
      SmallVectorBase::set_size((SmallVectorBase *)this,(size_t)MinSize);
    }
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::
  operator=(const SmallVectorImpl<T> &RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd;
    if (RHSSize)
      NewEnd = std::copy(RHS.begin(), RHS.begin()+RHSSize, this->begin());
    else
      NewEnd = this->begin();

    // Destroy excess elements.
    this->destroy_range(NewEnd, this->end());

    // Trim.
    this->set_size(RHSSize);
    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: don't do this if they're efficiently moveable.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->set_size(0);
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::copy(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Copy construct the new elements in place.
  this->uninitialized_copy(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->set_size(RHSSize);
  return *this;
}